

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

ArrayIndex __thiscall Json::Value::size(Value *this)

{
  byte bVar1;
  ArrayIndex AVar2;
  long lVar3;
  
  bVar1 = this->field_0x8;
  AVar2 = 0;
  if (5 < bVar1) {
    if (bVar1 == 7) {
      AVar2 = (ArrayIndex)(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else {
      if (bVar1 != 6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                      ,0x310,"ArrayIndex Json::Value::size() const");
      }
      AVar2 = 0;
      if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
        lVar3 = std::_Rb_tree_decrement
                          (&(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_header);
        AVar2 = *(int *)(lVar3 + 0x28) + 1;
      }
    }
  }
  return AVar2;
}

Assistant:

ArrayIndex Value::size() const {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
  case stringValue:
    return 0;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue: // size of the array is highest index + 1
    if (!value_.map_->empty()) {
      ObjectValues::const_iterator itLast = value_.map_->end();
      --itLast;
      return (*itLast).first.index() + 1;
    }
    return 0;
  case objectValue:
    return ArrayIndex(value_.map_->size());
#else
  case arrayValue:
    return Int(value_.array_->size());
  case objectValue:
    return Int(value_.map_->size());
#endif
  }
  JSON_ASSERT_UNREACHABLE;
  return 0; // unreachable;
}